

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-cardinalities.cc
# Opt level: O0

Cardinality __thiscall testing::Between(testing *this,int min,int max)

{
  BetweenCardinalityImpl *this_00;
  linked_ptr_internal extraout_RDX;
  Cardinality CVar1;
  int max_local;
  int min_local;
  
  this_00 = (BetweenCardinalityImpl *)operator_new(0x10);
  anon_unknown_6::BetweenCardinalityImpl::BetweenCardinalityImpl(this_00,min,max);
  Cardinality::Cardinality((Cardinality *)this,(CardinalityInterface *)this_00);
  CVar1.impl_.link_.next_ = extraout_RDX.next_;
  CVar1.impl_.value_ = (CardinalityInterface *)this;
  return (Cardinality)CVar1.impl_;
}

Assistant:

GTEST_API_ Cardinality Between(int min, int max) {
  return Cardinality(new BetweenCardinalityImpl(min, max));
}